

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subset.hpp
# Opt level: O0

bool ut11::Operands::IsIterableContainingSubset<std::vector<int,std::allocator<int>>>::
     CompareListsAndRemoveFirstDuplicate<std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>,std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>
               (list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *a,list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *b)

{
  iterator this;
  bool bVar1;
  reference p_Var2;
  reference a_00;
  reference b_00;
  const_iterator local_58;
  _List_node_base *local_50;
  const_iterator local_48;
  _Self local_40;
  _Self local_38;
  iterator j;
  _Self local_28;
  iterator i;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  *b_local;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  *a_local;
  
  i._M_node = (_List_node_base *)b;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::begin(a);
  do {
    j = std::__cxx11::
        list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::end(a);
    bVar1 = std::operator!=(&local_28,&j);
    if (!bVar1) {
      return false;
    }
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::begin(i._M_node);
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::end(i._M_node);
      bVar1 = std::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      p_Var2 = std::
               _List_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&local_28);
      a_00 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(p_Var2);
      p_Var2 = std::
               _List_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&local_38);
      b_00 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(p_Var2);
      bVar1 = utility::AreEqual<int,int>(a_00,b_00);
      if (bVar1) {
        std::
        _List_const_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
        ::_List_const_iterator(&local_48,&local_28);
        local_50 = (_List_node_base *)
                   std::__cxx11::
                   list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::erase(a,local_48);
        this = i;
        std::
        _List_const_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
        ::_List_const_iterator(&local_58,&local_38);
        std::__cxx11::
        list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::erase((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)this._M_node,local_58);
        return true;
      }
      std::
      _List_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&local_38);
    }
    std::
    _List_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

static bool CompareListsAndRemoveFirstDuplicate(A& a, B& b)
			{
				for(auto i = a.begin(); i != a.end(); ++i)
					for(auto j = b.begin(); j != b.end(); ++j)
						if ( utility::AreEqual(**i, **j) )
						{
							a.erase(i);
							b.erase(j);
							return true;
						}

				return false;
			}